

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O0

void cmd_copy(command *dest,command *src)

{
  char *pcVar1;
  int local_1c;
  wchar_t i;
  command *src_local;
  command *dest_local;
  
  memcpy(dest,src,0xb0);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    if (dest->arg[local_1c].type == arg_STRING) {
      pcVar1 = string_make(src->arg[local_1c].data.string);
      dest->arg[local_1c].data.string = pcVar1;
    }
  }
  return;
}

Assistant:

void cmd_copy(struct command *dest, const struct command *src)
{
	int i;

	*dest = *src;
	/* String arguments require a deep copy. */
	for (i = 0; i < CMD_MAX_ARGS; ++i) {
		if (dest->arg[i].type == arg_STRING) {
			dest->arg[i].data.string =
				string_make(src->arg[i].data.string);
		}
	}
}